

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

int32 Js::JavascriptOperators::OP_GetNativeIntElementI_UInt32
                (Var instance,uint32 index,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined4 *puVar6;
  Var index_00;
  double value;
  
  if ((int)index < 0) {
    value = (double)index;
    uVar4 = NumberUtilities::ToSpecial(value);
    bVar2 = NumberUtilities::IsNan(value);
    if (bVar2) {
      uVar5 = NumberUtilities::ToSpecial(value);
      if (uVar5 != 0xfff8000000000000) {
        uVar5 = NumberUtilities::ToSpecial(value);
        if (uVar5 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
      }
    }
    index_00 = (Var)(uVar4 ^ 0xfffc000000000000);
  }
  else {
    index_00 = (Var)((ulong)index | 0x1000000000000);
  }
  iVar3 = OP_GetNativeIntElementI(instance,index_00);
  return iVar3;
}

Assistant:

int32 JavascriptOperators::OP_GetNativeIntElementI_UInt32(Var instance, uint32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_GetNativeIntElementI_UInt32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_GetNativeIntElementI_UInt32, Op_GetNativeIntElementI);
#if FLOATVAR
        return OP_GetNativeIntElementI(instance, Js::JavascriptNumber::ToVar(index, scriptContext));
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_GetNativeIntElementI(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer));
#endif
        JIT_HELPER_END(Op_GetNativeIntElementI_UInt32);
    }